

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.h
# Opt level: O2

Pointer __thiscall
snestistics::AnnotationResolver::find_last_free_before_or_at
          (AnnotationResolver *this,Pointer p,Pointer stop)

{
  pointer pAVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    if ((int)p + lVar4 < (long)(int)stop) {
      return stop;
    }
    if (p + (int)lVar4 < (uint)(this->_annotation_for_adress)._size) {
      piVar2 = Array<int>::operator[](&this->_annotation_for_adress,(int)p + lVar4);
      lVar3 = (long)*piVar2;
      if ((lVar3 != -1) &&
         (pAVar1 = (this->_annotations).
                   super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pAVar1[lVar3].type - ANNOTATION_FUNCTION < 2)) {
        if ((int)lVar4 != 0) {
          return pAVar1[lVar3].endOfRange + 1;
        }
        return 0xffffffff;
      }
    }
    lVar4 = lVar4 + -1;
  } while( true );
}

Assistant:

Pointer find_last_free_before_or_at(const Pointer p, const Pointer stop) const {
		// TODO: We could binary search annotations for stop instead to avoid linear search

		// Assume in same bank
		for (int i = p; i >= (int32_t)stop; i--) {
			if ((uint32_t)i >= _annotation_for_adress.size())
				continue;
			int ai = _annotation_for_adress[i];
			if (ai == -1)
				continue;
			const Annotation &a = _annotations[ai];
			if (a.type == ANNOTATION_FUNCTION || a.type == ANNOTATION_DATA) {
				if ((uint32_t)i == p)
					return INVALID_POINTER; // No valid
				return a.endOfRange+1;
			}
		}
		return stop;
	}